

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_DeclarationBinder.cpp
# Opt level: O1

void __thiscall
psy::C::DeclarationBinder::DiagnosticsReporter::TypeSpecifierMissingDefaultsToInt
          (DiagnosticsReporter *this,SyntaxToken *declTk)

{
  long *local_130 [2];
  long local_120 [2];
  long *local_110 [2];
  long local_100 [2];
  long *local_f0 [2];
  long local_e0 [2];
  DiagnosticDescriptor local_d0;
  SyntaxToken local_68;
  
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,ID_of_TypeSpecifierMissingDefaultsToInt_abi_cxx11_._M_dataplus._M_p,
             ID_of_TypeSpecifierMissingDefaultsToInt_abi_cxx11_._M_dataplus._M_p +
             ID_of_TypeSpecifierMissingDefaultsToInt_abi_cxx11_._M_string_length);
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_110,"[[type specifier missing]]","");
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_130,"type specifier missing, defaults to `int\'","");
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_d0,local_f0,local_110,local_130,2,2);
  local_68.field_10 = declTk->field_10;
  local_68.tree_ = declTk->tree_;
  local_68.syntaxK_ = declTk->syntaxK_;
  local_68.byteSize_ = declTk->byteSize_;
  local_68.charSize_ = declTk->charSize_;
  local_68._14_2_ = *(undefined2 *)&declTk->field_0xe;
  local_68.byteOffset_ = declTk->byteOffset_;
  local_68.charOffset_ = declTk->charOffset_;
  local_68.matchingBracket_ = declTk->matchingBracket_;
  local_68.field_7 = declTk->field_7;
  local_68._34_2_ = *(undefined2 *)&declTk->field_0x22;
  local_68.lineno_ = declTk->lineno_;
  local_68.column_ = declTk->column_;
  local_68._44_4_ = *(undefined4 *)&declTk->field_0x2c;
  diagnose(this,&local_d0,&local_68);
  SyntaxToken::~SyntaxToken(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.description_._M_dataplus._M_p != &local_d0.description_.field_2) {
    operator_delete(local_d0.description_._M_dataplus._M_p,
                    local_d0.description_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.title_._M_dataplus._M_p != &local_d0.title_.field_2) {
    operator_delete(local_d0.title_._M_dataplus._M_p,
                    local_d0.title_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.id_._M_dataplus._M_p != &local_d0.id_.field_2) {
    operator_delete(local_d0.id_._M_dataplus._M_p,local_d0.id_.field_2._M_allocated_capacity + 1);
  }
  if (local_130[0] != local_120) {
    operator_delete(local_130[0],local_120[0] + 1);
  }
  if (local_110[0] != local_100) {
    operator_delete(local_110[0],local_100[0] + 1);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  return;
}

Assistant:

void DeclarationBinder::DiagnosticsReporter::TypeSpecifierMissingDefaultsToInt(SyntaxToken declTk)
{
    diagnose(DiagnosticDescriptor(
                 ID_of_TypeSpecifierMissingDefaultsToInt,
                 "[[type specifier missing]]",
                 "type specifier missing, defaults to `int'",
                 DiagnosticSeverity::Error,
                 DiagnosticCategory::Binding),
             declTk);
}